

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

int IsValidSimpleFormat(WebPDemuxer *dmux)

{
  Frame *pFVar1;
  int iVar2;
  
  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    if ((((0 < dmux->canvas_width) && (0 < dmux->canvas_height)) &&
        (pFVar1 = dmux->frames, dmux->state != WEBP_DEMUX_DONE || pFVar1 != (Frame *)0x0)) &&
       (0 < pFVar1->width)) {
      return (int)(0 < pFVar1->height);
    }
  }
  return iVar2;
}

Assistant:

static int IsValidSimpleFormat(const WebPDemuxer* const dmux) {
  const Frame* const frame = dmux->frames;
  if (dmux->state == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width <= 0 || dmux->canvas_height <= 0) return 0;
  if (dmux->state == WEBP_DEMUX_DONE && frame == NULL) return 0;

  if (frame->width <= 0 || frame->height <= 0) return 0;
  return 1;
}